

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *
JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::New<Memory::Recycler>
          (Recycler *alloc,uint *buffer,int count)

{
  Recycler *alloc_00;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer>::typeinfo
  ;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26e34b;
  data.filename._0_4_ = 0x46;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_50);
  this = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
         new<Memory::Recycler>(0x20,alloc_00,0x37ff80);
  ReadOnlyList(this,buffer,count,alloc);
  return this;
}

Assistant:

static ReadOnlyList * New(UAllocator* alloc, __in_ecount(count) T* buffer, DECLSPEC_GUARD_OVERFLOW int count)
        {
            return AllocatorNew(UAllocator, alloc, ReadOnlyList, buffer, count, alloc);
        }